

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O0

llama_ubatch * __thiscall llama_sbatch::split_simple(llama_sbatch *this,size_t n_ubatch)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  long in_RSI;
  llama_ubatch *in_RDI;
  bool in_stack_00000017;
  size_t in_stack_00000018;
  llama_sbatch *in_stack_00000020;
  size_t length;
  llama_sbatch_seq *s;
  size_t in_stack_00000088;
  llama_sbatch_seq *in_stack_00000090;
  llama_ubatch *in_stack_00000098;
  llama_sbatch *in_stack_000000a0;
  llama_ubatch *this_00;
  
  this_00 = in_RDI;
  reserve_ubatch(in_stack_00000020,in_stack_00000018,in_stack_00000017);
  in_RDI->equal_seqs = false;
  bVar1 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::empty
                    ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)this_00);
  if (!bVar1) {
    pvVar2 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::operator[]
                       ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)
                        (in_RSI + 0x48),0);
    sVar3 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::size
                      ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)
                       (in_RSI + 0x48));
    if ((sVar3 != 1) || (pvVar2->n_seq_id != 0)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
                 ,0x93,"GGML_ASSERT(%s) failed","seq.size() == 1 && s.n_seq_id == 0");
    }
    add_seq_to_ubatch(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088);
  }
  return this_00;
}

Assistant:

llama_ubatch llama_sbatch::split_simple(size_t n_ubatch) {
    n_ubatch = n_tokens < n_ubatch ? n_tokens : n_ubatch;
    llama_ubatch ubatch = reserve_ubatch(n_ubatch, /* has_embd */ batch->embd != nullptr);
    ubatch.equal_seqs = false;
    if (!seq.empty()) {
        llama_sbatch_seq & s = seq[0];
        size_t length = s.length < n_ubatch ? s.length : n_ubatch;
        GGML_ASSERT(seq.size() == 1 && s.n_seq_id == 0); // don't mix with other splits
        add_seq_to_ubatch(ubatch, s, length);
    }
    return ubatch;
}